

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool skip_ws_delim(char **begin,char *end,char delim)

{
  byte bVar1;
  _Bool _Var2;
  char *it;
  byte *local_28;
  
  local_28 = (byte *)*begin;
  if (local_28 < end) {
    bVar1 = *local_28;
    if (((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
       (bVar1 != delim)) {
      return false;
    }
  }
  _Var2 = skip_ws((char **)&local_28,end);
  if ((local_28 < end && _Var2) && (*local_28 == delim)) {
    local_28 = local_28 + 1;
    skip_ws((char **)&local_28,end);
  }
  *begin = (char *)local_28;
  return local_28 < end;
}

Assistant:

static inline bool skip_ws_delim(const char** begin, const char* end, char delim)
{
    const char* it = *begin;
    if(it < end && !IS_WS(*it) && *it != delim)
        return false;
    if(skip_ws(&it, end)) {
        if(skip_delim(&it, end, delim)) {
            skip_ws(&it, end);
        }
    }

    *begin = it;
    return it < end;
}